

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_bbdpre.c
# Opt level: O0

int IDABBDPrecReInit(void *ida_mem,sunindextype mudq,sunindextype mldq,sunrealtype dq_rel_yy)

{
  long *plVar1;
  long in_RDX;
  long in_RSI;
  IDAMem in_RDI;
  double in_XMM0_Qa;
  sunindextype Nlocal;
  IBBDPrecData pdata;
  IDALsMem idals_mem;
  IDAMem IDA_mem;
  double local_98;
  double local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_68;
  long local_60;
  long local_58;
  int local_4;
  
  if (in_RDI == (IDAMem)0x0) {
    IDAProcessError((IDAMem)0x0,-1,0x139,"IDABBDPrecReInit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_bbdpre.c"
                    ,"Integrator memory is NULL.");
    local_4 = -1;
  }
  else if (in_RDI->ida_lmem == (void *)0x0) {
    IDAProcessError(in_RDI,-2,0x142,"IDABBDPrecReInit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_bbdpre.c"
                    ,
                    "Linear solver memory is NULL. One of the SPILS linear solvers must be attached."
                   );
    local_4 = -2;
  }
  else if (*(long *)((long)in_RDI->ida_lmem + 0x118) == 0) {
    IDAProcessError(in_RDI,-5,0x14b,"IDABBDPrecReInit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_bbdpre.c"
                    ,"BBD peconditioner memory is NULL. IDABBDPrecInit must be called.");
    local_4 = -5;
  }
  else {
    plVar1 = *(long **)((long)in_RDI->ida_lmem + 0x118);
    local_80 = plVar1[7];
    local_58 = in_RSI;
    if (in_RSI < 0) {
      local_58 = 0;
    }
    if (local_80 + -1 < local_58) {
      local_60 = local_80 + -1;
    }
    else {
      local_68 = in_RSI;
      if (in_RSI < 0) {
        local_68 = 0;
      }
      local_60 = local_68;
    }
    *plVar1 = local_60;
    local_78 = in_RDX;
    if (in_RDX < 0) {
      local_78 = 0;
    }
    if (local_80 + -1 < local_78) {
      local_80 = local_80 + -1;
    }
    else {
      local_88 = in_RDX;
      if (in_RDX < 0) {
        local_88 = 0;
      }
      local_80 = local_88;
    }
    plVar1[1] = local_80;
    local_90 = in_XMM0_Qa;
    if (in_XMM0_Qa <= 0.0) {
      if (0.0 < in_RDI->ida_uround) {
        local_98 = sqrt(in_RDI->ida_uround);
      }
      else {
        local_98 = 0.0;
      }
      local_90 = local_98;
    }
    plVar1[4] = (long)local_90;
    plVar1[0x12] = 0;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int IDABBDPrecReInit(void* ida_mem, sunindextype mudq, sunindextype mldq,
                     sunrealtype dq_rel_yy)
{
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  IBBDPrecData pdata;
  sunindextype Nlocal;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDALS_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSGBBD_MEM_NULL);
    return (IDALS_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  /* Test if the LS linear solver interface has been created */
  if (IDA_mem->ida_lmem == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_LMEM_NULL, __LINE__, __func__, __FILE__,
                    MSGBBD_LMEM_NULL);
    return (IDALS_LMEM_NULL);
  }
  idals_mem = (IDALsMem)IDA_mem->ida_lmem;

  /* Test if the preconditioner data is non-NULL */
  if (idals_mem->pdata == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_PMEM_NULL, __LINE__, __func__, __FILE__,
                    MSGBBD_PMEM_NULL);
    return (IDALS_PMEM_NULL);
  }
  pdata = (IBBDPrecData)idals_mem->pdata;

  /* Load half-bandwidths. */
  Nlocal      = pdata->n_local;
  pdata->mudq = SUNMIN(Nlocal - 1, SUNMAX(0, mudq));
  pdata->mldq = SUNMIN(Nlocal - 1, SUNMAX(0, mldq));

  /* Set rel_yy based on input value dq_rel_yy (0 implies default). */
  pdata->rel_yy = (dq_rel_yy > ZERO) ? dq_rel_yy : SUNRsqrt(IDA_mem->ida_uround);

  /* Re-initialize nge */
  pdata->nge = 0;

  return (IDALS_SUCCESS);
}